

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.c
# Opt level: O0

void assert_true(TestReporter *reporter,char *file,int line,int result,char *message,...)

{
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  va_list arguments;
  undefined1 auStackY_e8 [4];
  int in_stack_ffffffffffffff1c;
  TestReporter *in_stack_ffffffffffffff20;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  int local_18;
  undefined4 local_14;
  undefined8 local_10;
  long local_8;
  
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_38,0,0x18);
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x28;
  if (local_18 == 0) {
    local_28 = auStackY_e8;
    (**(code **)(local_8 + 0x28))(local_8,local_10,local_14,local_20,&local_38);
  }
  else {
    local_28 = auStackY_e8;
    (**(code **)(local_8 + 0x18))(local_8,local_10,local_14,local_20,&local_38);
  }
  add_reporter_result(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  return;
}

Assistant:

static void assert_true(TestReporter *reporter, const char *file, int line,
                        int result, const char *message, ...) {
    va_list arguments;
    memset(&arguments, 0, sizeof(va_list));

    va_start(arguments, message);
    if (result) {
            (*reporter->show_pass)(reporter, file, line, message, arguments);
    } else {
            (*reporter->show_fail)(reporter, file, line, message, arguments);
    }

    add_reporter_result(reporter, result);
    va_end(arguments);
}